

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

BasicMutSuffix<double> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::FindSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<double> *sufdef)

{
  SuffixBase SVar1;
  SuffixBase SVar2;
  Kind kind;
  
  kind = sufdef->kind_ & PROBLEM;
  SuffixManager::Check(kind);
  SVar1.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::Find
                                  ((this->super_SuffixManager).suffixes_ + kind,sufdef->name_);
  if ((SuffixBase)SVar1.impl_ == (SuffixBase)0x0) {
    SVar2.impl_ = (Impl *)0x0;
  }
  else {
    SVar2.impl_ = (Impl *)0x0;
    if (((SVar1.impl_)->kind & 4) != 0) {
      SVar2.impl_ = SVar1.impl_;
    }
  }
  return (BasicMutSuffix<double>)SVar2.impl_;
}

Assistant:

BasicMutSuffix<T> FindSuffix(const SuffixDef<T>& sufdef) {
    auto main_kind = (suf::Kind)(sufdef.kind() & suf::KIND_MASK);
    auto suf_raw = suffixes(main_kind).Find(sufdef.name());
    if (suf_raw)
      return Cast< BasicMutSuffix<T> >( suf_raw );
    return BasicMutSuffix<T>();
  }